

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<crnlib::dxt_hc::color_cluster>::~vector(vector<crnlib::dxt_hc::color_cluster> *this)

{
  color_quad<unsigned_char,_int> *p;
  void *p_00;
  color_cluster *p_01;
  long lVar1;
  color_cluster *pcVar2;
  
  p_01 = this->m_p;
  if (p_01 != (color_cluster *)0x0) {
    if ((ulong)this->m_size != 0) {
      pcVar2 = p_01 + this->m_size;
      do {
        p = (p_01->pixels).m_p;
        if (p != (color_quad<unsigned_char,_int> *)0x0) {
          crnlib_free(p);
        }
        lVar1 = 0x30;
        do {
          p_00 = *(void **)((long)(p_01->blocks + -1) + lVar1);
          if (p_00 != (void *)0x0) {
            crnlib_free(p_00);
          }
          lVar1 = lVar1 + -0x10;
        } while (lVar1 != 0);
        p_01 = p_01 + 1;
      } while (p_01 != pcVar2);
      p_01 = this->m_p;
    }
    crnlib_free(p_01);
  }
  return;
}

Assistant:

inline ~vector() {
    if (m_p) {
      scalar_type<T>::destruct_array(m_p, m_size);
      crnlib_free(m_p);
    }
  }